

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void cmExtraEclipseCDT4Generator::AddEnvVar(ostream *out,char *envVar,cmLocalGenerator *lg)

{
  cmMakefile *this;
  bool bVar1;
  cmState *this_00;
  cmValue cVar2;
  long lVar3;
  cmake *this_01;
  string *path;
  size_t sVar4;
  ostream *poVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string valueToUse;
  string envVarValue;
  string cacheEntryName;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  size_t local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  this = lg->Makefile;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::GetEnv(envVar,&local_70);
  local_80 = strlen(envVar);
  local_90._M_len = 0x15;
  local_90._M_str = "CMAKE_ECLIPSE_ENVVAR_";
  views._M_len = 2;
  views._M_array = &local_90;
  local_78 = envVar;
  cmCatViews_abi_cxx11_(&local_50,views);
  this_00 = cmLocalGenerator::GetState(lg);
  cVar2 = cmState::GetInitializedCacheValue(this_00,&local_50);
  local_90._M_str = (char *)0x0;
  local_80 = local_80 & 0xffffffffffffff00;
  local_90._M_len = (size_t)&local_80;
  if (bVar1) {
    if (cVar2.Value == (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&local_90);
      cmMakefile::AddCacheDefinition
                (this,&local_50,(char *)local_90._M_len,local_50._M_dataplus._M_p,STRING,true);
      this_01 = cmMakefile::GetCMakeInstance(this);
      path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_90);
      lVar3 = std::__cxx11::string::find((char *)&local_90,(ulong)local_70._M_dataplus._M_p,0);
      if (lVar3 != -1) goto LAB_0030f305;
      std::__cxx11::string::_M_assign((string *)&local_90);
      cmMakefile::AddCacheDefinition
                (this,&local_50,(char *)local_90._M_len,local_50._M_dataplus._M_p,STRING,true);
      this_01 = cmMakefile::GetCMakeInstance(this);
      path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
    }
    cmake::SaveCache(this_01,path);
  }
  else {
    if (cVar2.Value == (string *)0x0) goto LAB_0030f37b;
    std::__cxx11::string::_M_assign((string *)&local_90);
  }
LAB_0030f305:
  if (local_90._M_str != (char *)0x0) {
    if (envVar == (char *)0x0) {
      std::ios::clear((int)out + (int)out->_vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(envVar);
      std::__ostream_insert<char,std::char_traits<char>>(out,envVar,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"=",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_90._M_len,(long)local_90._M_str);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
  }
LAB_0030f37b:
  if ((size_t *)local_90._M_len != &local_80) {
    operator_delete((void *)local_90._M_len,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(std::ostream& out,
                                            const char* envVar,
                                            cmLocalGenerator& lg)
{
  cmMakefile* mf = lg.GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  std::string envVarValue;
  const bool envVarSet = cmSystemTools::GetEnv(envVar, envVarValue);

  std::string cacheEntryName = cmStrCat("CMAKE_ECLIPSE_ENVVAR_", envVar);
  cmValue cacheValue = lg.GetState()->GetInitializedCacheValue(cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (!envVarSet && !cacheValue) {
    // nothing known, do nothing
    valueToUse.clear();
  } else if (envVarSet && !cacheValue) {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse, cacheEntryName.c_str(),
                           cmStateEnums::STRING, true);
    mf->GetCMakeInstance()->SaveCache(lg.GetBinaryDirectory());
  } else if (!envVarSet && cacheValue) {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = *cacheValue;
  } else {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = *cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos) {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse,
                             cacheEntryName.c_str(), cmStateEnums::STRING,
                             true);
      mf->GetCMakeInstance()->SaveCache(lg.GetBinaryDirectory());
    }
  }

  if (!valueToUse.empty()) {
    out << envVar << "=" << valueToUse << "|";
  }
}